

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern_formatter-inl.h
# Opt level: O0

void __thiscall
spdlog::details::level_formatter<spdlog::details::null_scoped_padder>::format
          (level_formatter<spdlog::details::null_scoped_padder> *this,log_msg *msg,tm *param_3,
          memory_buf_t *dest)

{
  string_view_t view;
  string_view_t *this_00;
  size_t sVar1;
  memory_buf_t *in_RCX;
  long in_RSI;
  long in_RDI;
  null_scoped_padder p;
  string_view_t *level_name;
  memory_buf_t *in_stack_ffffffffffffffd0;
  
  this_00 = level::to_string_view(*(level_enum *)(in_RSI + 0x10));
  sVar1 = fmt::v6::basic_string_view<char>::size(this_00);
  null_scoped_padder::null_scoped_padder
            ((null_scoped_padder *)&stack0xffffffffffffffd7,sVar1,(padding_info *)(in_RDI + 8),
             in_RCX);
  view.size_ = (size_t)in_RCX;
  view.data_ = (char *)this_00;
  fmt_helper::append_string_view(view,in_stack_ffffffffffffffd0);
  return;
}

Assistant:

void format(const details::log_msg &msg, const std::tm &, memory_buf_t &dest) override
    {
        string_view_t &level_name = level::to_string_view(msg.level);
        ScopedPadder p(level_name.size(), padinfo_, dest);
        fmt_helper::append_string_view(level_name, dest);
    }